

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tools.cpp
# Opt level: O1

int __thiscall miniros::network::HttpFrame::incrementalParse(HttpFrame *this)

{
  int *piVar1;
  ParserState PVar2;
  pointer pcVar3;
  size_type sVar4;
  ulong uVar5;
  int iVar6;
  Token *pTVar7;
  int *piVar8;
  int iVar9;
  char *__s1;
  pointer __nptr;
  pointer pcVar10;
  int iVar11;
  int iVar12;
  pointer __s1_00;
  ulong uVar13;
  long lVar14;
  Field field;
  undefined1 local_b0 [32];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  pointer local_70;
  vector<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>
  *local_68;
  int *local_60;
  Token *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar3 = (this->data)._M_dataplus._M_p;
  sVar4 = (this->data)._M_string_length;
  __s1_00 = pcVar3 + this->m_currentPosition;
  __nptr = pcVar3 + this->m_tokenStart;
  iVar9 = (int)pcVar3;
  if ((long)this->m_currentPosition < (long)sVar4) {
    pcVar10 = pcVar3 + sVar4;
    local_68 = &this->fields;
    piVar1 = &(this->requestType).end;
    local_58 = &this->requestUrl;
    local_60 = &(this->requestUrl).end;
    do {
      PVar2 = this->m_state;
      if (PVar2 == ParseFieldValue) {
        iVar12 = strncmp(__s1_00,"\r\n",2);
        if (iVar12 != 0) goto LAB_001dcd8f;
        lVar14 = (long)(this->m_fieldName).start;
        __s1 = pcVar3 + lVar14;
        iVar12 = strncasecmp(__s1,"Content-length",0xe);
        if (iVar12 == 0) {
          iVar12 = atoi(__nptr);
          this->m_contentLength = iVar12;
        }
        else {
          iVar12 = strncasecmp(__s1,"Connection",10);
          if (iVar12 == 0) {
            iVar12 = strncasecmp(__nptr,"keep-alive",10);
            if (iVar12 == 0) {
              this->m_keepAlive = true;
            }
            else {
              iVar12 = strncasecmp(__nptr,"close",5);
              if (iVar12 == 0) {
                this->m_keepAlive = false;
              }
            }
          }
          else {
            local_b0._0_8_ = local_b0 + 0x10;
            local_b0._8_8_ = 0;
            local_b0[0x10] = '\0';
            local_90._M_p = (pointer)&local_80;
            local_88 = 0;
            local_80._M_local_buf[0] = '\0';
            local_70 = pcVar10;
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,__s1,__s1 + ((this->m_fieldName).end - lVar14));
            std::__cxx11::string::operator=((string *)local_b0,(string *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__nptr,__s1_00);
            pcVar10 = local_70;
            std::__cxx11::string::operator=((string *)&local_90,(string *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            std::
            vector<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>
            ::emplace_back<miniros::network::HttpFrame::Field>(local_68,(Field *)local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_p != &local_80) {
              operator_delete(local_90._M_p,
                              CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]
                                      ) + 1);
            }
            if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
              operator_delete((void *)local_b0._0_8_,CONCAT71(local_b0._17_7_,local_b0[0x10]) + 1);
            }
          }
        }
LAB_001dcdb9:
        __nptr = __s1_00 + 2;
        this->m_state = ParseFieldName;
        __s1_00 = __nptr;
      }
      else {
        iVar12 = (int)__nptr;
        iVar11 = (int)__s1_00;
        if (PVar2 == ParseFieldName) {
          if (*__s1_00 == ':') {
            this->m_state = ParseFieldValue;
            (this->m_fieldName).start = iVar12 - iVar9;
            (this->m_fieldName).end = iVar11 - iVar9;
            __nptr = __s1_00 + 1;
            __s1_00 = __nptr;
            goto LAB_001dcdc7;
          }
          iVar12 = strncmp(__s1_00,"\n\n",2);
          if ((iVar12 == 0) || (iVar12 = strncmp(__s1_00,"\r\n",2), iVar12 == 0)) {
            this->m_state = ParseBody;
            __nptr = __s1_00 + 2;
            this->m_bodyPosition = (int)__nptr - iVar9;
            __s1_00 = __nptr;
            break;
          }
        }
        else {
          if (PVar2 != ParseRequest) break;
          iVar6 = strncmp(__s1_00,"\r\n",2);
          if (iVar6 == 0) {
            (this->requestHttpVersion).start = iVar12 - iVar9;
            (this->requestHttpVersion).end = iVar11 - iVar9;
            goto LAB_001dcdb9;
          }
          if ((((this->requestType).start == *piVar1) &&
              (pTVar7 = &this->requestType, piVar8 = piVar1, *__s1_00 == ' ')) ||
             ((local_58->start == *local_60 &&
              (pTVar7 = local_58, piVar8 = local_60, *__s1_00 == ' ')))) {
            pTVar7->start = iVar12 - iVar9;
            *piVar8 = iVar11 - iVar9;
            __nptr = __s1_00 + 1;
          }
        }
LAB_001dcd8f:
        __s1_00 = __s1_00 + 1;
      }
LAB_001dcdc7:
    } while (__s1_00 < pcVar10);
  }
  iVar12 = (int)__s1_00;
  this->m_tokenStart = (int)__nptr - iVar9;
  if (this->m_state == ParseBody) {
    if ((long)this->m_contentLength < 0) {
      this->m_state = ParseComplete;
      uVar13 = (ulong)this->m_bodyPosition;
    }
    else {
      uVar13 = (long)this->m_bodyPosition + (long)this->m_contentLength;
      uVar5 = (this->data)._M_string_length;
      if (uVar5 < uVar13) {
        iVar12 = (int)uVar5 + iVar9;
        goto LAB_001dce76;
      }
      this->m_state = ParseComplete;
    }
    this->m_bodyEnd = (int)uVar13;
    iVar12 = (int)uVar13 + iVar9;
  }
LAB_001dce76:
  iVar11 = this->m_currentPosition;
  this->m_currentPosition = iVar12 - iVar9;
  return (iVar12 - iVar9) - iVar11;
}

Assistant:

int HttpFrame::incrementalParse()
{
  const char *start = data.c_str();
  const char *end = start + data.length();
  const char* cp = start + m_currentPosition;

  const char* tokenStart = start + m_tokenStart;

  for (; cp < end;) {
    if (m_state == HttpFrame::ParseRequest) {
      if (strncmp(cp, "\r\n", 2) == 0) {
        requestHttpVersion.assign(tokenStart - start, cp - start);
        cp += 2;
        tokenStart = cp;
        m_state = HttpFrame::ParseFieldName;
        continue;
      } if (requestType.empty() && *cp == ' ') {
        requestType.assign(tokenStart - start, cp - start);
        tokenStart = cp + 1;
      } else if (requestUrl.empty() && *cp == ' ') {
        requestUrl.assign(tokenStart - start, cp - start);
        tokenStart = cp + 1;
      } else {
        // Error?
      }
    }
    else if (m_state == HttpFrame::ParseFieldName) {
      if (*cp == ':') {
        m_state = HttpFrame::ParseFieldValue;
        m_fieldName.assign(tokenStart - start, cp - start);
        cp++;
        tokenStart = cp;
        continue;
      }

      if (strncmp(cp, "\n\n", 2) == 0 || strncmp(cp, "\r\n", 2) == 0) {
        m_state = HttpFrame::ParseBody;
        cp += 2;
        tokenStart = cp;
        m_bodyPosition = cp - start;
        break;
      }
    } else if (m_state == HttpFrame::ParseFieldValue) {
      assert(tokenStart != nullptr);
      if (strncmp(cp, "\r\n", 2) == 0) {
        const char* namePtr = start + m_fieldName.start;
        if (strncasecmp(namePtr, "Content-length", 14) == 0)  {
          m_contentLength = atoi(tokenStart);
        } else if (strncasecmp(namePtr, "Connection", 10) == 0) {
          if (strncasecmp(tokenStart, "keep-alive", 10) == 0) {
            m_keepAlive = true;
          } else if (strncasecmp(tokenStart, "close", 5) == 0) {
            m_keepAlive = false;
          }
        } else {
          Field field;
          field.name = std::string(namePtr, m_fieldName.size());
          field.value = std::string(tokenStart, cp - tokenStart);
          fields.push_back(std::move(field));
        }
        cp += 2;
        tokenStart = cp;
        m_state = HttpFrame::ParseFieldName;
        continue;
      }
    } else // Any other state.
      break;
    cp++;
  }
  m_tokenStart = tokenStart - start;

  if (m_state == HttpFrame::ParseBody) {
    if (m_contentLength >= 0) {
      // Need body and got all the data.
      if (m_bodyPosition + m_contentLength <= data.length()) {
        m_state = HttpFrame::ParseComplete;
        m_bodyEnd = m_bodyPosition + m_contentLength;
        cp = start + m_bodyEnd;
      } else {
        // `data` does not contain full body yet, but need to advance `cp`.
        cp = start + data.length();
      }
    } else {
      m_state = HttpFrame::ParseComplete;
      m_bodyEnd = m_bodyPosition;
      cp = start + m_bodyEnd;
    }
  }

  int position = cp - start;
  int bytesParsed = position - m_currentPosition;
  m_currentPosition = position;

  return bytesParsed;
}